

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

GCobj * io_std_new(lua_State *L,FILE *fp,char *name)

{
  undefined8 *puVar1;
  GCobj *pGVar2;
  GCudata *ud;
  IOFileUD *iof;
  char *name_local;
  FILE *fp_local;
  lua_State *L_local;
  
  puVar1 = (undefined8 *)lua_newuserdata(L,0x10);
  pGVar2 = (GCobj *)(L->top[-1].u64 & 0x7fffffffffff);
  (pGVar2->gch).unused1 = '\x01';
  (pGVar2->th).base = (TValue *)(L->top[-3].u64 & 0x7fffffffffff);
  *puVar1 = fp;
  *(undefined4 *)(puVar1 + 1) = 2;
  lua_setfield(L,-2,name);
  return pGVar2;
}

Assistant:

static GCobj *io_std_new(lua_State *L, FILE *fp, const char *name)
{
  IOFileUD *iof = (IOFileUD *)lua_newuserdata(L, sizeof(IOFileUD));
  GCudata *ud = udataV(L->top-1);
  ud->udtype = UDTYPE_IO_FILE;
  /* NOBARRIER: The GCudata is new (marked white). */
  setgcref(ud->metatable, gcV(L->top-3));
  iof->fp = fp;
  iof->type = IOFILE_TYPE_STDF;
  lua_setfield(L, -2, name);
  return obj2gco(ud);
}